

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void PushWarnings(UniValue *warnings,UniValue *obj)

{
  long lVar1;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff68;
  UniValue in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((warnings->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (warnings->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffc8,"warnings",
               (allocator<char> *)&stack0xffffffffffffff6f);
    UniValue::UniValue((UniValue *)&stack0xffffffffffffff70,warnings);
    UniValue::pushKV(obj,in_stack_ffffffffffffff68,in_stack_ffffffffffffff88);
    UniValue::~UniValue((UniValue *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PushWarnings(const UniValue& warnings, UniValue& obj)
{
    if (warnings.empty()) return;
    obj.pushKV("warnings", warnings);
}